

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cpp
# Opt level: O2

int ncnn::gru_int8(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc_int8,
                  float *weight_xc_int8_scales,Mat *bias_c,Mat *weight_hc_int8,
                  float *weight_hc_int8_scales,Mat *hidden_state,Option *opt)

{
  uint _h;
  uint _h_00;
  size_t sVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined1 uVar4;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined4 uVar11;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined4 uVar19;
  undefined1 uVar20;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined8 uVar27;
  int *piVar34;
  void *pvVar35;
  void *pvVar36;
  int iVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  int iVar42;
  void *pvVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  ulong uVar47;
  float *pfVar48;
  long lVar49;
  void *pvVar50;
  int iVar51;
  int iVar52;
  ulong uVar53;
  int iVar54;
  ulong uVar55;
  void *pvVar56;
  void *pvVar57;
  void *pvVar58;
  long lVar59;
  ulong uVar60;
  void *pvVar61;
  uint uVar62;
  ulong uVar63;
  long lVar64;
  void *pvVar65;
  float absmax;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined4 in_XMM4_Db;
  undefined4 in_XMM4_Dc;
  undefined4 in_XMM4_Dd;
  float *bias_c_U;
  float *bias_c_R;
  Mat local_218;
  Option opt_quant;
  Mat local_178;
  Mat local_128;
  Mat local_d8;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  Option opt_quant_1;
  undefined4 uVar5;
  undefined3 uVar7;
  undefined2 uVar9;
  undefined4 uVar13;
  undefined3 uVar15;
  undefined2 uVar17;
  undefined4 uVar21;
  undefined3 uVar23;
  undefined2 uVar25;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined3 uVar30;
  undefined1 uVar31;
  undefined2 uVar32;
  undefined1 uVar33;
  
  uVar62 = bottom_blob->w;
  _h = bottom_blob->h;
  _h_00 = top_blob->w;
  local_218.cstep = 0;
  local_218.data = (void *)0x0;
  local_218.refcount._0_4_ = 0;
  local_218.refcount._4_4_ = 0;
  local_218.elemsize._0_4_ = 0;
  local_218.elemsize._4_4_ = 0;
  local_218.elempack = 0;
  local_218.allocator = (Allocator *)0x0;
  local_218.dims = 0;
  local_218.w = 0;
  local_218.h = 0;
  local_218.d = 0;
  local_218.c = 0;
  Mat::create(&local_218,2,_h_00,4,opt->workspace_allocator);
  iVar37 = -100;
  if ((local_218.data != (void *)0x0) && ((long)local_218.c * local_218.cstep != 0)) {
    local_128.cstep = 0;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 0;
    local_128.elemsize._4_4_ = 0;
    local_128.elempack = 0;
    local_128.allocator = (Allocator *)0x0;
    local_128.dims = 0;
    local_128.w = 0;
    local_128.h = 0;
    local_128.d = 0;
    local_128.c = 0;
    Mat::create(&local_128,uVar62,_h,1,1,opt->workspace_allocator);
    local_d8.cstep = 0;
    local_d8.data = (void *)0x0;
    local_d8.refcount._0_4_ = 0;
    local_d8.refcount._4_4_ = 0;
    local_d8.elemsize._0_4_ = 0;
    local_d8._20_8_ = 0;
    local_d8.allocator = (Allocator *)0x0;
    local_d8.dims = 0;
    local_d8.w = 0;
    local_d8.h = 0;
    local_d8.d = 0;
    local_d8.c = 0;
    Mat::create(&local_d8,_h,4,1,opt->workspace_allocator);
    lVar38 = (long)(int)_h_00;
    iVar37 = bottom_blob->w;
    sVar1 = bottom_blob->elemsize;
    pvVar43 = bottom_blob->data;
    uVar53 = 0;
    uVar63 = (ulong)uVar62;
    if ((int)uVar62 < 1) {
      uVar63 = uVar53;
    }
    uVar60 = 0;
    if (0 < (int)_h) {
      uVar60 = (ulong)_h;
    }
    for (; uVar53 != uVar60; uVar53 = uVar53 + 1) {
      fVar66 = 0.0;
      for (uVar55 = 0; uVar63 != uVar55; uVar55 = uVar55 + 1) {
        fVar69 = ABS(*(float *)((long)pvVar43 + uVar55 * 4));
        if (fVar66 <= fVar69) {
          fVar66 = fVar69;
        }
      }
      *(float *)((long)local_d8.data + uVar53 * 4) = 127.0 / fVar66;
      pvVar43 = (void *)((long)pvVar43 + (long)iVar37 * sVar1);
    }
    opt_quant.lightmode = opt->lightmode;
    opt_quant.use_shader_pack8 = opt->use_shader_pack8;
    opt_quant.use_subgroup_ops = opt->use_subgroup_ops;
    opt_quant.use_reserved_0 = opt->use_reserved_0;
    opt_quant.num_threads = opt->num_threads;
    uVar3 = opt->openmp_blocktime;
    uVar4 = opt->use_winograd_convolution;
    uVar6 = opt->use_sgemm_convolution;
    uVar8 = opt->use_int8_inference;
    uVar10 = opt->use_vulkan_compute;
    uVar9 = CONCAT11(uVar10,uVar8);
    uVar7 = CONCAT21(uVar9,uVar6);
    uVar5 = CONCAT31(uVar7,uVar4);
    uVar53._0_1_ = opt->use_bf16_storage;
    uVar53._1_1_ = opt->use_fp16_packed;
    uVar53._2_1_ = opt->use_fp16_storage;
    uVar53._3_1_ = opt->use_fp16_arithmetic;
    uVar53._4_1_ = opt->use_int8_packed;
    uVar53._5_1_ = opt->use_int8_storage;
    uVar53._6_1_ = opt->use_int8_arithmetic;
    uVar53._7_1_ = opt->use_packing_layout;
    uVar11 = opt->vulkan_device_index;
    uVar12 = opt->use_reserved_1;
    uVar14 = opt->use_image_storage;
    uVar16 = opt->use_tensor_storage;
    uVar18 = opt->use_reserved_2;
    uVar17 = CONCAT11(uVar18,uVar16);
    uVar15 = CONCAT21(uVar17,uVar14);
    uVar13 = CONCAT31(uVar15,uVar12);
    uVar19 = opt->flush_denormals;
    uVar20 = opt->use_local_pool_allocator;
    uVar22 = opt->use_shader_local_memory;
    uVar24 = opt->use_cooperative_matrix;
    uVar26 = opt->use_winograd23_convolution;
    uVar25 = CONCAT11(uVar26,uVar24);
    uVar23 = CONCAT21(uVar25,uVar22);
    uVar21 = CONCAT31(uVar23,uVar20);
    uVar27._0_1_ = opt->use_winograd43_convolution;
    uVar27._1_1_ = opt->use_winograd63_convolution;
    uVar27._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar27._3_1_ = opt->use_fp16_uniform;
    uVar28 = opt->use_int8_uniform;
    uVar29 = opt->use_reserved_9;
    uVar31 = opt->use_reserved_10;
    uVar33 = opt->use_reserved_11;
    uVar32 = CONCAT11(uVar33,uVar31);
    uVar30 = CONCAT21(uVar32,uVar29);
    uVar27._4_4_ = CONCAT31(uVar30,uVar28);
    opt_quant._56_4_ = SUB84(uVar27,0);
    opt_quant.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_quant.workspace_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_quant.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_quant.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_quant._32_8_ = uVar53 & 0xffffffffffffff;
    opt_quant.openmp_blocktime = uVar3;
    opt_quant._28_4_ = uVar5;
    opt_quant.vulkan_device_index = uVar11;
    opt_quant._44_4_ = uVar13;
    opt_quant.flush_denormals = uVar19;
    opt_quant._52_4_ = uVar21;
    opt_quant._60_4_ = uVar27._4_4_;
    quantize_to_int8(bottom_blob,&local_128,&local_d8,&opt_quant);
    opt_quant.lightmode = false;
    opt_quant.use_shader_pack8 = false;
    opt_quant.use_subgroup_ops = false;
    opt_quant.use_reserved_0 = false;
    opt_quant.num_threads = 0;
    opt_quant.blob_allocator._0_4_ = 0;
    opt_quant.blob_allocator._4_4_ = 0;
    opt_quant.workspace_allocator._0_4_ = 0;
    opt_quant.workspace_allocator._4_4_ = 0;
    opt_quant.openmp_blocktime = 0;
    opt_quant.use_bf16_storage = false;
    opt_quant.use_fp16_packed = false;
    opt_quant.use_fp16_storage = false;
    opt_quant.use_fp16_arithmetic = false;
    opt_quant.use_int8_packed = false;
    opt_quant.use_int8_storage = false;
    opt_quant.use_int8_arithmetic = false;
    opt_quant.use_packing_layout = false;
    opt_quant.vulkan_device_index = 0;
    opt_quant.use_reserved_1 = false;
    opt_quant.use_image_storage = false;
    opt_quant.use_tensor_storage = false;
    opt_quant.use_reserved_2 = false;
    opt_quant.flush_denormals = 0;
    opt_quant.use_local_pool_allocator = false;
    opt_quant.use_shader_local_memory = false;
    opt_quant.use_cooperative_matrix = false;
    opt_quant.use_winograd23_convolution = false;
    opt_quant.use_winograd43_convolution = false;
    opt_quant.use_winograd63_convolution = false;
    opt_quant.use_a53_a55_optimized_kernel = false;
    opt_quant.use_fp16_uniform = false;
    Mat::create((Mat *)&opt_quant,_h_00,1,1,opt->workspace_allocator);
    local_178.cstep = 0;
    local_178.data = (float *)0x0;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.elemsize._0_4_ = 0;
    local_178._20_8_ = 0;
    local_178.allocator = (Allocator *)0x0;
    local_178.dims = 0;
    local_178.w = 0;
    local_178.h = 0;
    local_178.d = 0;
    local_178.c = 0;
    Mat::create(&local_178,1,4,1,opt->workspace_allocator);
    uVar53 = 0;
    if (0 < (int)_h_00) {
      uVar53 = (ulong)_h_00;
    }
    lVar39 = (long)(int)(_h_00 * 2);
    for (uVar62 = 0; uVar62 != (uint)uVar60; uVar62 = uVar62 + 1) {
      fVar66 = 0.0;
      for (uVar55 = 0; uVar53 != uVar55; uVar55 = uVar55 + 1) {
        fVar69 = ABS(*(float *)((long)hidden_state->data + uVar55 * 4));
        if (fVar66 <= fVar69) {
          fVar66 = fVar69;
        }
      }
      uVar2 = ~uVar62 + _h;
      if (reverse == 0) {
        uVar2 = uVar62;
      }
      if (fVar66 == 0.0) {
        *(float *)local_178.data = 1.0;
        for (lVar46 = 0; lVar46 != 0; lVar46 = lVar46 + 1) {
          *(undefined1 *)(opt_quant._0_8_ + lVar46) = 0;
        }
      }
      else {
        *(float *)local_178.data = 127.0 / fVar66;
        opt_quant_1.lightmode = opt->lightmode;
        opt_quant_1.use_shader_pack8 = opt->use_shader_pack8;
        opt_quant_1.use_subgroup_ops = opt->use_subgroup_ops;
        opt_quant_1.use_reserved_0 = opt->use_reserved_0;
        opt_quant_1.num_threads = opt->num_threads;
        opt_quant_1.workspace_allocator = opt->workspace_allocator;
        opt_quant_1.openmp_blocktime = opt->openmp_blocktime;
        opt_quant_1.use_winograd_convolution = opt->use_winograd_convolution;
        opt_quant_1.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_quant_1.use_int8_inference = opt->use_int8_inference;
        opt_quant_1.use_vulkan_compute = opt->use_vulkan_compute;
        uVar55._0_1_ = opt->use_bf16_storage;
        uVar55._1_1_ = opt->use_fp16_packed;
        uVar55._2_1_ = opt->use_fp16_storage;
        uVar55._3_1_ = opt->use_fp16_arithmetic;
        uVar55._4_1_ = opt->use_int8_packed;
        uVar55._5_1_ = opt->use_int8_storage;
        uVar55._6_1_ = opt->use_int8_arithmetic;
        uVar55._7_1_ = opt->use_packing_layout;
        opt_quant_1.vulkan_device_index = opt->vulkan_device_index;
        opt_quant_1.use_reserved_1 = opt->use_reserved_1;
        opt_quant_1.use_image_storage = opt->use_image_storage;
        opt_quant_1.use_tensor_storage = opt->use_tensor_storage;
        opt_quant_1.use_reserved_2 = opt->use_reserved_2;
        opt_quant_1.flush_denormals = opt->flush_denormals;
        opt_quant_1.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_quant_1.use_shader_local_memory = opt->use_shader_local_memory;
        opt_quant_1.use_cooperative_matrix = opt->use_cooperative_matrix;
        opt_quant_1.use_winograd23_convolution = opt->use_winograd23_convolution;
        opt_quant_1.use_winograd43_convolution = opt->use_winograd43_convolution;
        opt_quant_1.use_winograd63_convolution = opt->use_winograd63_convolution;
        opt_quant_1.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
        opt_quant_1.use_fp16_uniform = opt->use_fp16_uniform;
        opt_quant_1.use_int8_uniform = opt->use_int8_uniform;
        opt_quant_1.use_reserved_9 = opt->use_reserved_9;
        opt_quant_1.use_reserved_10 = opt->use_reserved_10;
        opt_quant_1.use_reserved_11 = opt->use_reserved_11;
        opt_quant_1.blob_allocator = opt->workspace_allocator;
        opt_quant_1._32_8_ = uVar55 & 0xffffffffffffff;
        quantize_to_int8(hidden_state,(Mat *)&opt_quant,&local_178,&opt_quant_1);
      }
      pvVar36 = local_128.data;
      uVar27 = opt_quant._0_8_;
      pvVar35 = local_218.data;
      lVar44 = (long)(int)uVar2;
      lVar59 = local_128.w * lVar44 *
               CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
      fVar66 = 1.0 / *(float *)((long)local_d8.data + lVar44 * 4);
      fVar69 = 1.0 / *local_178.data;
      lVar40 = (long)local_218.w;
      lVar46 = CONCAT44(local_218.elemsize._4_4_,(undefined4)local_218.elemsize);
      lVar41 = (long)bias_c->w * bias_c->elemsize;
      pvVar43 = bias_c->data;
      pvVar56 = weight_xc_int8->data;
      pvVar57 = weight_hc_int8->data;
      lVar64 = (long)weight_xc_int8->w * weight_xc_int8->elemsize;
      pvVar58 = (void *)(lVar64 * lVar38 + (long)pvVar56);
      lVar49 = (long)weight_hc_int8->w * weight_hc_int8->elemsize;
      pvVar61 = (void *)(lVar49 * lVar38 + (long)pvVar57);
      pvVar50 = (void *)(lVar49 * lVar39 + (long)pvVar57);
      pvVar65 = (void *)(lVar64 * lVar39 + (long)pvVar56);
      for (uVar55 = 0; uVar55 != uVar53; uVar55 = uVar55 + 1) {
        lVar45 = lVar40 * lVar46 * uVar55;
        iVar37 = 0;
        iVar42 = 0;
        for (uVar47 = 0; uVar63 != uVar47; uVar47 = uVar47 + 1) {
          iVar51 = (int)*(char *)((long)pvVar36 + uVar47 + lVar59);
          iVar42 = iVar42 + *(char *)((long)pvVar56 + uVar47) * iVar51;
          iVar37 = iVar37 + *(char *)((long)pvVar58 + uVar47) * iVar51;
        }
        iVar51 = 0;
        iVar52 = 0;
        for (uVar47 = 0; _h_00 != uVar47; uVar47 = uVar47 + 1) {
          iVar54 = (int)*(char *)(uVar27 + uVar47);
          iVar52 = iVar52 + *(char *)((long)pvVar57 + uVar47) * iVar54;
          iVar51 = iVar51 + *(char *)((long)pvVar61 + uVar47) * iVar54;
        }
        local_88 = ((float)iVar51 * fVar69) / weight_hc_int8_scales[lVar38 + uVar55] +
                   ((float)iVar37 * fVar66) / weight_xc_int8_scales[lVar38 + uVar55] +
                   *(float *)((long)pvVar43 + uVar55 * 4 + lVar41);
        uStack_84 = in_XMM4_Db;
        uStack_80 = in_XMM4_Dc;
        uStack_7c = in_XMM4_Dd;
        fVar67 = expf(-(((float)iVar52 * fVar69) / weight_hc_int8_scales[uVar55] +
                        ((float)iVar42 * fVar66) / weight_xc_int8_scales[uVar55] +
                       *(float *)((long)pvVar43 + uVar55 * 4)));
        fVar68 = expf(-local_88);
        iVar37 = 0;
        for (uVar47 = 0; _h_00 != uVar47; uVar47 = uVar47 + 1) {
          iVar37 = iVar37 + (int)*(char *)((long)pvVar50 + uVar47) * (int)*(char *)(uVar27 + uVar47)
          ;
        }
        in_XMM4_Db = 0;
        in_XMM4_Dc = 0;
        in_XMM4_Dd = 0;
        iVar42 = 0;
        for (uVar47 = 0; uVar63 != uVar47; uVar47 = uVar47 + 1) {
          iVar42 = iVar42 + (int)*(char *)((long)pvVar65 + uVar47) *
                            (int)*(char *)((long)pvVar36 + uVar47 + lVar59);
        }
        fVar67 = tanhf(((float)iVar42 * fVar66) / weight_xc_int8_scales[lVar39 + uVar55] +
                       *(float *)((long)pvVar43 + uVar55 * 4 + lVar41 * 2) +
                       (((float)iVar37 * fVar69) / weight_hc_int8_scales[lVar39 + uVar55] +
                       *(float *)((long)pvVar43 + uVar55 * 4 + lVar41 * 3)) / (fVar67 + 1.0));
        *(float *)((long)pvVar35 + lVar45) = 1.0 / (fVar68 + 1.0);
        *(float *)((long)pvVar35 + lVar45 + 4) = fVar67;
        pvVar58 = (void *)((long)pvVar58 + lVar64);
        pvVar56 = (void *)((long)pvVar56 + lVar64);
        pvVar61 = (void *)((long)pvVar61 + lVar49);
        pvVar57 = (void *)((long)pvVar57 + lVar49);
        pvVar50 = (void *)((long)pvVar50 + lVar49);
        pvVar65 = (void *)((long)pvVar65 + lVar64);
      }
      iVar37 = top_blob->w;
      sVar1 = top_blob->elemsize;
      pvVar43 = top_blob->data;
      pvVar56 = hidden_state->data;
      pfVar48 = (float *)((long)local_218.data + 4);
      for (uVar55 = 0; uVar53 != uVar55; uVar55 = uVar55 + 1) {
        fVar66 = (*(float *)((long)pvVar56 + uVar55 * 4) - *pfVar48) * pfVar48[-1] + *pfVar48;
        *(float *)((long)pvVar56 + uVar55 * 4) = fVar66;
        *(float *)((long)pvVar43 + uVar55 * 4 + iVar37 * lVar44 * sVar1) = fVar66;
        pfVar48 = (float *)((long)pfVar48 +
                           (long)local_218.w *
                           CONCAT44(local_218.elemsize._4_4_,(undefined4)local_218.elemsize));
      }
    }
    piVar34 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
    if (piVar34 != (int *)0x0) {
      LOCK();
      *piVar34 = *piVar34 + -1;
      UNLOCK();
      if (*piVar34 == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          free(local_178.data);
        }
        else {
          (*(local_178.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar34 = (int *)CONCAT44(opt_quant.blob_allocator._4_4_,opt_quant.blob_allocator._0_4_);
    if (piVar34 != (int *)0x0) {
      LOCK();
      *piVar34 = *piVar34 + -1;
      UNLOCK();
      if (*piVar34 == 0) {
        if (opt_quant._32_8_ == 0) {
          free((void *)opt_quant._0_8_);
        }
        else {
          (**(code **)(*(long *)opt_quant._32_8_ + 0x18))();
        }
      }
    }
    piVar34 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar34 != (int *)0x0) {
      LOCK();
      *piVar34 = *piVar34 + -1;
      UNLOCK();
      if (*piVar34 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          free(local_d8.data);
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar34 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
    if (piVar34 != (int *)0x0) {
      LOCK();
      *piVar34 = *piVar34 + -1;
      UNLOCK();
      if (*piVar34 == 0) {
        if (local_128.allocator == (Allocator *)0x0) {
          free(local_128.data);
        }
        else {
          (*(local_128.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar37 = 0;
  }
  piVar34 = (int *)CONCAT44(local_218.refcount._4_4_,local_218.refcount._0_4_);
  if (piVar34 != (int *)0x0) {
    LOCK();
    *piVar34 = *piVar34 + -1;
    UNLOCK();
    if (*piVar34 == 0) {
      if (local_218.allocator == (Allocator *)0x0) {
        free(local_218.data);
      }
      else {
        (*(local_218.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar37;
}

Assistant:

static int gru_int8(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc_int8, const float* weight_xc_int8_scales, const Mat& bias_c, const Mat& weight_hc_int8, const float* weight_hc_int8_scales, Mat& hidden_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // 2 x num_output
    Mat gates(2, num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // dynamic quantize bottom_blob
    Mat bottom_blob_int8(size, T, (size_t)1u, 1, opt.workspace_allocator);
    Mat bottom_blob_int8_scales(T, (size_t)4u, 1, opt.workspace_allocator);
    {
        for (int t = 0; t < T; t++)
        {
            const float* x = bottom_blob.row(t);

            float absmax = 0.f;
            for (int i = 0; i < size; i++)
            {
                absmax = std::max(absmax, (float)fabs(x[i]));
            }

            bottom_blob_int8_scales[t] = 127.f / absmax;
        }

        Option opt_quant = opt;
        opt_quant.blob_allocator = opt.workspace_allocator;
        opt_quant.use_packing_layout = false;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_quant);
    }

    Mat hidden_state_int8(num_output, (size_t)1u, 1, opt.workspace_allocator);
    Mat hidden_state_int8_scales(1, (size_t)4u, 1, opt.workspace_allocator);

    // unroll
    for (int t = 0; t < T; t++)
    {
        int ti = reverse ? T - 1 - t : t;

        // dynamic quantize hidden_state
        {
            float absmax = 0.f;
            for (int i = 0; i < num_output; i++)
            {
                absmax = std::max(absmax, (float)fabs(hidden_state[i]));
            }

            if (absmax == 0.f)
            {
                hidden_state_int8_scales[0] = 1.f;
                hidden_state_int8.fill<signed char>(0);
            }
            else
            {
                hidden_state_int8_scales[0] = 127.f / absmax;

                Option opt_quant = opt;
                opt_quant.blob_allocator = opt.workspace_allocator;
                opt_quant.use_packing_layout = false;
                quantize_to_int8(hidden_state, hidden_state_int8, hidden_state_int8_scales, opt_quant);
            }
        }

        const signed char* x = bottom_blob_int8.row<const signed char>(ti);
        const signed char* hs = hidden_state_int8;
        const float descale_x = 1.f / bottom_blob_int8_scales[ti];
        const float descale_h = 1.f / hidden_state_int8_scales[0];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            float* gates_data = gates.row(q);

            // gate reset update
            const float* bias_c_R = bias_c.row(0);
            const float* bias_c_U = bias_c.row(1);

            const signed char* weight_xc_int8_R = weight_xc_int8.row<const signed char>(num_output * 0 + q);
            const signed char* weight_xc_int8_U = weight_xc_int8.row<const signed char>(num_output * 1 + q);
            const signed char* weight_hc_int8_R = weight_hc_int8.row<const signed char>(num_output * 0 + q);
            const signed char* weight_hc_int8_U = weight_hc_int8.row<const signed char>(num_output * 1 + q);

            const float descale_xc_R = 1.f / weight_xc_int8_scales[num_output * 0 + q];
            const float descale_xc_U = 1.f / weight_xc_int8_scales[num_output * 1 + q];
            const float descale_hc_R = 1.f / weight_hc_int8_scales[num_output * 0 + q];
            const float descale_hc_U = 1.f / weight_hc_int8_scales[num_output * 1 + q];

            int Rx = 0;
            int Ux = 0;
            for (int i = 0; i < size; i++)
            {
                signed char xi = x[i];

                Rx += weight_xc_int8_R[i] * xi;
                Ux += weight_xc_int8_U[i] * xi;
            }

            int Rh = 0;
            int Uh = 0;
            for (int i = 0; i < num_output; i++)
            {
                signed char h_cont = hs[i];

                Rh += weight_hc_int8_R[i] * h_cont;
                Uh += weight_hc_int8_U[i] * h_cont;
            }

            float R = bias_c_R[q] + Rx * (descale_x * descale_xc_R) + Rh * (descale_h * descale_hc_R);
            float U = bias_c_U[q] + Ux * (descale_x * descale_xc_U) + Uh * (descale_h * descale_hc_U);

            // sigmoid(R)
            // sigmoid(U)
            R = 1.f / (1.f + expf(-R));
            U = 1.f / (1.f + expf(-U));

            // gate new
            const float* bias_c_WN = bias_c.row(2);
            const float* bias_c_BN = bias_c.row(3);

            const signed char* weight_xc_int8_N = weight_xc_int8.row<const signed char>(num_output * 2 + q);
            const signed char* weight_hc_int8_N = weight_hc_int8.row<const signed char>(num_output * 2 + q);

            const float descale_xc_N = 1.f / weight_xc_int8_scales[num_output * 2 + q];
            const float descale_hc_N = 1.f / weight_hc_int8_scales[num_output * 2 + q];

            int Nh = 0;
            for (int i = 0; i < num_output; i++)
            {
                signed char h_cont = hs[i];

                Nh += weight_hc_int8_N[i] * h_cont;
            }

            int Nx = 0;
            for (int i = 0; i < size; i++)
            {
                signed char xi = x[i];

                Nx += weight_xc_int8_N[i] * xi;
            }

            float N = bias_c_BN[q] + Nh * (descale_h * descale_hc_N);
            N = bias_c_WN[q] + R * N + Nx * (descale_x * descale_xc_N);

            // tanh(N)
            N = tanhf(N);

            gates_data[0] = U;
            gates_data[1] = N;
        }

        // h_t := (1 - update) .* new + update .* h_{t-1}
        float* output_data = top_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            const float* gates_data = gates.row(q);

            float U = gates_data[0];
            float N = gates_data[1];

            float H = (1 - U) * N + U * hidden_state[q];

            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}